

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<float,_std::allocator<float>_> *
readFromSep<float>(vector<float,_std::allocator<float>_> *__return_storage_ptr__,char *cdata,
                  char sep)

{
  bool bVar1;
  double dVar2;
  float local_24;
  uint local_20;
  undefined1 local_1a;
  char local_19;
  uint begin;
  char sep_local;
  char *cdata_local;
  vector<float,_std::allocator<float>_> *arr;
  
  local_1a = 0;
  local_19 = sep;
  _begin = cdata;
  cdata_local = (char *)__return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  local_20 = 0;
  while (_begin[local_20] != '\0') {
    dVar2 = atof(_begin + local_20);
    local_24 = (float)dVar2;
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_24);
    do {
      local_20 = local_20 + 1;
      bVar1 = false;
      if (_begin[local_20] != '\0') {
        bVar1 = _begin[local_20] != local_19;
      }
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<T> readFromSep(const char * cdata, char sep=' ') {
    vector<T> arr;
    unsigned int begin = 0;
    while (cdata[begin] != '\0') {
        arr.push_back((float)atof(cdata + begin));
        ++begin;
        while (cdata[begin] != '\0' && cdata[begin] != sep) {
            ++begin;
        }
    }
    return arr;
}